

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

int64_t swap8s(int64_t n,int doit)

{
  ulong uVar1;
  int doit_local;
  int64_t n_local;
  
  n_local = n;
  if (doit != 0) {
    uVar1 = (n & 0xff00ff00ff00ffU) << 8 | n >> 8 & 0xff00ff00ff00ffU;
    uVar1 = (uVar1 & 0xffff0000ffff) << 0x10 | (long)uVar1 >> 0x10 & 0xffff0000ffffU;
    n_local = uVar1 << 0x20 | (long)uVar1 >> 0x20 & 0xffffffffU;
  }
  return n_local;
}

Assistant:

int64_t swap8s(int64_t n, int doit)
{
    if (doit)
    {
        n = ((n <<  8) & 0xff00ff00ff00ff00ULL) |
            ((n >>  8) & 0x00ff00ff00ff00ffULL);
        n = ((n << 16) & 0xffff0000ffff0000ULL) |
            ((n >> 16) & 0x0000ffff0000ffffULL );
        return (n << 32) | ((n >> 32) & 0xffffffffULL);
    }
    return n;
}